

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

void __thiscall Hypergraph::addNet(Hypergraph *this,Net *net)

{
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar2;
  size_type sVar3;
  reference puVar4;
  reference this_01;
  const_iterator cStack_38;
  uint cell_index;
  const_iterator __end1;
  const_iterator __begin1;
  Net *__range1;
  Net *pNStack_18;
  uint net_index;
  Net *net_local;
  Hypergraph *this_local;
  
  pNStack_18 = net;
  net_local = (Net *)this;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(net);
  if (sVar3 < 2) {
    __assert_fail("net.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]hypergraph-partitioning/FM.cpp"
                  ,7,"void Hypergraph::addNet(const Net &)");
  }
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(&this->nets_);
  this_00 = pNStack_18;
  __range1._4_4_ = (undefined4)sVar3;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pNStack_18);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8);
    if (!bVar2) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::push_back(&this->nets_,pNStack_18);
      return;
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    uVar1 = *puVar4;
    sVar3 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(&this->cells_);
    if (sVar3 <= uVar1) break;
    this_01 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](&this->cells_,(ulong)uVar1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_01,(value_type_conflict *)((long)&__range1 + 4));
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("cell_index < cells_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]hypergraph-partitioning/FM.cpp"
                ,10,"void Hypergraph::addNet(const Net &)");
}

Assistant:

void Hypergraph::addNet(const Net &net) {
  assert(net.size() >= 2);
  unsigned net_index = nets_.size();
  for (auto cell_index : net) {
    assert(cell_index < cells_.size());
    cells_[cell_index].push_back(net_index);
  }
  nets_.push_back(net);
}